

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histogram_enc.c
# Opt level: O1

void VP8LHistogramInit(VP8LHistogram *p,int palette_code_bits,int init_arrays)

{
  uint32_t *puVar1;
  int iVar2;
  
  p->palette_code_bits_ = palette_code_bits;
  if (init_arrays == 0) {
    *(undefined8 *)((long)&p->red_cost_ + 5) = 0;
    *(undefined8 *)((long)&p->blue_cost_ + 5) = 0;
    *(undefined8 *)((long)&p->literal_cost_ + 4) = 0;
    *(undefined8 *)((long)&p->red_cost_ + 4) = 0;
    *(undefined8 *)&p->trivial_symbol_ = 0;
    *(undefined8 *)((long)&p->bit_cost_ + 4) = 0;
  }
  else {
    puVar1 = p->literal_;
    iVar2 = (4 << ((byte)palette_code_bits & 0x1f)) + 0x1138;
    if (palette_code_bits < 1) {
      iVar2 = 0x1138;
    }
    memset(p,0,(long)iVar2);
    p->palette_code_bits_ = palette_code_bits;
    p->literal_ = puVar1;
  }
  return;
}

Assistant:

void VP8LHistogramInit(VP8LHistogram* const p, int palette_code_bits,
                       int init_arrays) {
  p->palette_code_bits_ = palette_code_bits;
  if (init_arrays) {
    HistogramClear(p);
  } else {
    p->trivial_symbol_ = 0;
    p->bit_cost_ = 0.;
    p->literal_cost_ = 0.;
    p->red_cost_ = 0.;
    p->blue_cost_ = 0.;
    memset(p->is_used_, 0, sizeof(p->is_used_));
  }
}